

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdAddBlindTxInData(void *handle,void *blind_handle,char *txid,uint32_t vout,char *asset_string,
                       char *asset_blind_factor,char *value_blind_factor,int64_t value_satoshi,
                       char *asset_key,char *token_key)

{
  bool bVar1;
  undefined8 uVar2;
  undefined4 in_ECX;
  char *in_RDX;
  long in_RSI;
  char *in_R8;
  char *in_R9;
  Amount AVar3;
  char *in_stack_00000008;
  int64_t in_stack_00000010;
  char *in_stack_00000018;
  string *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  TxInBlindParameters params;
  CfdCapiBlindTxData *buffer;
  Privkey *in_stack_fffffffffffffa28;
  TxInBlindParameters *in_stack_fffffffffffffa30;
  value_type *in_stack_fffffffffffffa38;
  string *in_stack_fffffffffffffa40;
  undefined8 in_stack_fffffffffffffa48;
  CfdError error_code;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  string *in_stack_fffffffffffffb38;
  void *in_stack_fffffffffffffb40;
  Privkey local_4a0;
  allocator local_479;
  string local_478;
  Privkey local_458;
  allocator local_431;
  string local_430;
  BlindFactor local_410;
  allocator local_3e9;
  string local_3e8;
  BlindFactor local_3c8;
  allocator local_3a1;
  string local_3a0;
  BlindFactor local_380;
  allocator local_359;
  string local_358;
  BlindFactor local_338;
  int64_t local_318;
  undefined1 local_310;
  Amount local_308;
  ConfidentialValue local_2f8;
  allocator local_2c9;
  string local_2c8;
  ConfidentialAssetId local_2a8;
  allocator local_279;
  string local_278;
  Txid local_258;
  Txid local_238;
  undefined4 local_218;
  ConfidentialAssetId local_210;
  BlindFactor local_1e8;
  BlindFactor local_1c8;
  ConfidentialValue local_1a8;
  undefined1 local_180;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  CfdSourceLocation local_110;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [48];
  char *local_38;
  char *local_30;
  undefined4 local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa48 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"BlindTxData",&local_69);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  if (*(long *)(local_18 + 0x10) == 0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x49c;
    local_90.funcname = "CfdAddBlindTxInData";
    cfd::core::logger::warn<>(&local_90,"buffer state is illegal.");
    local_b2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. buffer state is illegal.",&local_b1)
    ;
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
               error_code,in_stack_fffffffffffffa40);
    local_b2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(local_30);
    if (!bVar1) {
      cfd::api::TxInBlindParameters::TxInBlindParameters
                ((TxInBlindParameters *)
                 CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_278,local_20,&local_279);
      cfd::core::Txid::Txid(&local_258,&local_278);
      cfd::core::Txid::operator=(&local_238,&local_258);
      cfd::core::Txid::~Txid((Txid *)0x5ae91d);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
      local_218 = local_24;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2c8,local_30,&local_2c9);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_2a8,&local_2c8);
      cfd::core::ConfidentialAssetId::operator=(&local_210,&local_2a8);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5ae9c4);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      AVar3 = cfd::core::Amount::CreateBySatoshiAmount(in_stack_00000010);
      local_318 = AVar3.amount_;
      local_310 = AVar3.ignore_check_;
      local_308.amount_ = local_318;
      local_308.ignore_check_ = (bool)local_310;
      cfd::core::ConfidentialValue::ConfidentialValue(&local_2f8,&local_308);
      cfd::core::ConfidentialValue::operator=(&local_1a8,&local_2f8);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5aea73);
      bVar1 = cfd::capi::IsEmptyString(local_38);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_358,
                   "0000000000000000000000000000000000000000000000000000000000000000",&local_359);
        cfd::core::BlindFactor::BlindFactor(&local_338,&local_358);
        cfd::core::BlindFactor::operator=(&local_1e8,&local_338);
        cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5aeb01);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator((allocator<char> *)&local_359);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3a0,local_38,&local_3a1);
        cfd::core::BlindFactor::BlindFactor(&local_380,&local_3a0);
        cfd::core::BlindFactor::operator=(&local_1e8,&local_380);
        cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5aed16);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      }
      bVar1 = cfd::capi::IsEmptyString(in_stack_00000008);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3e8,
                   "0000000000000000000000000000000000000000000000000000000000000000",&local_3e9);
        cfd::core::BlindFactor::BlindFactor(&local_3c8,&local_3e8);
        cfd::core::BlindFactor::operator=(&local_1c8,&local_3c8);
        cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5aee26);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_430,in_stack_00000008,&local_431);
        cfd::core::BlindFactor::BlindFactor(&local_410,&local_430);
        cfd::core::BlindFactor::operator=(&local_1c8,&local_410);
        cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5aef24);
        std::__cxx11::string::~string((string *)&local_430);
        std::allocator<char>::~allocator((allocator<char> *)&local_431);
      }
      local_180 = 0;
      bVar1 = cfd::capi::IsEmptyString(in_stack_00000018);
      if (!bVar1) {
        local_180 = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_478,in_stack_00000018,&local_479);
        cfd::core::Privkey::Privkey(&local_458,&local_478,kMainnet,true);
        cfd::core::Privkey::operator=
                  ((Privkey *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
        cfd::core::Privkey::~Privkey((Privkey *)0x5af05c);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator((allocator<char> *)&local_479);
      }
      bVar1 = cfd::capi::IsEmptyString((char *)in_stack_00000020);
      if (!bVar1) {
        local_180 = 1;
        paVar4 = (allocator *)&stack0xfffffffffffffb3f;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffb40,(char *)in_stack_00000020,paVar4);
        cfd::core::Privkey::Privkey(&local_4a0,(string *)&stack0xfffffffffffffb40,kMainnet,true);
        cfd::core::Privkey::operator=
                  ((Privkey *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
        cfd::core::Privkey::~Privkey((Privkey *)0x5af16d);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffb40);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb3f);
        in_stack_fffffffffffffa40 = in_stack_00000020;
      }
      std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>::
      push_back((vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
                 *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      local_4 = 0;
      cfd::api::TxInBlindParameters::~TxInBlindParameters(in_stack_fffffffffffffa30);
      return local_4;
    }
    local_110.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_110.filename = local_110.filename + 1;
    local_110.line = 0x4a8;
    local_110.funcname = "CfdAddBlindTxInData";
    cfd::core::logger::warn<>(&local_110,"asset is null or empty.");
    local_132 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_130,"Failed to parameter. asset is null or empty.",&local_131);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
               error_code,in_stack_fffffffffffffa40);
    local_132 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_d0.filename = local_d0.filename + 1;
  local_d0.line = 0x4a2;
  local_d0.funcname = "CfdAddBlindTxInData";
  cfd::core::logger::warn<>(&local_d0,"txid is null or empty.");
  local_f2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Failed to parameter. txid is null or empty.",&local_f1);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
             error_code,in_stack_fffffffffffffa40);
  local_f2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddBlindTxInData(
    void* handle, void* blind_handle, const char* txid, uint32_t vout,
    const char* asset_string, const char* asset_blind_factor,
    const char* value_blind_factor, int64_t value_satoshi,
    const char* asset_key, const char* token_key) {
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->txin_blind_keys == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }

    TxInBlindParameters params;
    params.txid = Txid(txid);
    params.vout = vout;
    params.blind_param.asset = ConfidentialAssetId(asset_string);
    params.blind_param.value =
        ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    if (IsEmptyString(asset_blind_factor)) {
      params.blind_param.abf = BlindFactor(kEmpty32Bytes);
    } else {
      params.blind_param.abf = BlindFactor(asset_blind_factor);
    }
    if (IsEmptyString(value_blind_factor)) {
      params.blind_param.vbf = BlindFactor(kEmpty32Bytes);
    } else {
      params.blind_param.vbf = BlindFactor(value_blind_factor);
    }

    params.is_issuance = false;
    if (!IsEmptyString(asset_key)) {
      params.is_issuance = true;
      params.issuance_key.asset_key = Privkey(asset_key);
    }
    if (!IsEmptyString(token_key)) {
      params.is_issuance = true;
      params.issuance_key.token_key = Privkey(token_key);
    }

    buffer->txin_blind_keys->push_back(params);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}